

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff.cxx
# Opt level: O1

unique_ptr<vigra::Decoder,_std::default_delete<vigra::Decoder>_> __thiscall
vigra::TIFFCodecFactory::getDecoder(TIFFCodecFactory *this)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  
  TIFFSetWarningHandler(vigraWarningHandler);
  pp_Var1 = (_func_int **)operator_new(0x30);
  *pp_Var1 = (_func_int *)&PTR__Decoder_0015c938;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x2;
  p_Var2 = (_func_int *)operator_new(2);
  pp_Var1[2] = p_Var2;
  *pp_Var1 = (_func_int *)&PTR__TIFFDecoder_0015d7d8;
  pp_Var1[5] = (_func_int *)0x0;
  (this->super_CodecFactory)._vptr_CodecFactory = pp_Var1;
  return (__uniq_ptr_data<vigra::Decoder,_std::default_delete<vigra::Decoder>,_true,_true>)
         (__uniq_ptr_data<vigra::Decoder,_std::default_delete<vigra::Decoder>,_true,_true>)this;
}

Assistant:

VIGRA_UNIQUE_PTR<Decoder> TIFFCodecFactory::getDecoder() const
    {
        // use 'NULL' to silence all warnings
        TIFFSetWarningHandler((TIFFErrorHandler)&vigraWarningHandler);

        return VIGRA_UNIQUE_PTR<Decoder>( new TIFFDecoder() );
    }